

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticFacts.cpp
# Opt level: O2

DriveStrength slang::ast::getDriveStrengthVal(TokenKind kind)

{
  int iVar1;
  uint uVar2;
  undefined6 in_register_0000003a;
  ulong uVar3;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  uVar2 = iVar1 - 0x11f;
  uVar3 = (ulong)uVar2;
  if (uVar2 < 0x2e) {
    if ((3UL >> (uVar3 & 0x3f) & 1) != 0) {
      return Strong;
    }
    if ((0x30UL >> (uVar3 & 0x3f) & 1) != 0) {
      return Supply;
    }
    if ((0x300000000000U >> (uVar3 & 0x3f) & 1) != 0) {
      return Weak;
    }
  }
  if (1 < iVar1 - 0xb4U) {
    return Pull;
  }
  return HighZ;
}

Assistant:

static DriveStrength getDriveStrengthVal(TokenKind kind) {
    switch (kind) {
        case TokenKind::Supply0Keyword:
        case TokenKind::Supply1Keyword:
            return DriveStrength::Supply;
        case TokenKind::Strong0Keyword:
        case TokenKind::Strong1Keyword:
            return DriveStrength::Strong;
        case TokenKind::Weak0Keyword:
        case TokenKind::Weak1Keyword:
            return DriveStrength::Weak;
        case TokenKind::Pull0Keyword:
        case TokenKind::Pull1Keyword:
            return DriveStrength::Pull;
        case TokenKind::HighZ0Keyword:
        case TokenKind::HighZ1Keyword:
            return DriveStrength::HighZ;
        default:
            SLANG_UNREACHABLE;
    }
}